

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool absl::lts_20250127::debugging_internal::MaybeAppend(State *state,char *str)

{
  size_t length_00;
  size_t length;
  char *str_local;
  State *state_local;
  
  if (*(int *)&(state->parse_state).field_0xc < 0) {
    length_00 = StrLen(str);
    MaybeAppendWithLength(state,str,length_00);
  }
  return true;
}

Assistant:

static bool MaybeAppend(State *state, const char *const str) {
  if (state->parse_state.append) {
    size_t length = StrLen(str);
    MaybeAppendWithLength(state, str, length);
  }
  return true;
}